

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O1

void megumax::stats(Position *pos,UCTNode *node)

{
  pointer pUVar1;
  bool bVar2;
  int iVar3;
  UCTNode *this;
  ostream *poVar4;
  vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_> *pvVar5;
  uint __val;
  double dVar6;
  string __str;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  forward_position(pos,node);
  libchess::Position::display(pos,(ostream *)&std::cout);
  this = UCTNode::parent(node);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"depth: ",7);
  iVar3 = UCTNode::depth(node);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"visits: ",8);
  iVar3 = UCTNode::visits(node);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"score: ",7);
  dVar6 = UCTNode::score(node);
  poVar4 = std::ostream::_M_insert<double>(dVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"P: ",3);
  dVar6 = UCTNode::p(node,pos);
  poVar4 = std::ostream::_M_insert<double>(dVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Q: ",3);
  dVar6 = UCTNode::score(node);
  iVar3 = UCTNode::visits(node);
  poVar4 = std::ostream::_M_insert<double>(dVar6 / (double)iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  if (this != (UCTNode *)0x0) {
    pvVar5 = UCTNode::children(this);
    pUVar1 = (pvVar5->super__Vector_base<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>).
             _M_impl.super__Vector_impl_data._M_start;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"U: ",3);
    dVar6 = UCTNode::child_probability(this,((long)node - (long)pUVar1 >> 3) * 0x2e8ba2e8ba2e8ba3);
    poVar4 = std::ostream::_M_insert<double>(dVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  }
  bVar2 = UCTNode::is_terminal(node);
  __val = 0;
  if (!bVar2) {
    pvVar5 = UCTNode::children(node);
    __val = (uint)((pvVar5->super__Vector_base<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>)
                   ._M_impl.super__Vector_impl_data._M_start !=
                  (pvVar5->super__Vector_base<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>).
                  _M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"expanded: ",10);
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,'\x01');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_50,1,__val);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  iVar3 = UCTNode::depth(node);
  if (0 < iVar3) {
    iVar3 = iVar3 + 1;
    do {
      libchess::Position::unmake_move(pos);
      iVar3 = iVar3 + -1;
    } while (1 < iVar3);
  }
  return;
}

Assistant:

void stats(Position& pos, UCTNode* node) {
    forward_position(pos, node);

    pos.display();
    UCTNode* parent = node->parent();
    std::cout << "depth: " << node->depth() << "\n"
              << "visits: " << node->visits() << "\n"
              << "score: " << node->score() << "\n"
              << "P: " << node->p(pos) << "\n"
              << "Q: " << node->score() / node->visits() << "\n";
    if (parent != nullptr) {
        auto parent_relative_idx = node - parent->children().data();
        std::cout << "U: " << parent->child_probability(parent_relative_idx) << "\n";
    }
    bool is_expanded = (!node->is_terminal() && !node->children().empty());
    std::cout << "expanded: " << std::to_string(is_expanded) << "\n";

    rewind_position(pos, node->depth());
}